

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

int ON_SubDComponentPtrPair::CompareFirstPointer
              (ON_SubDComponentPtrPair *lhs,ON_SubDComponentPtrPair *rhs)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (lhs == rhs) {
    return 0;
  }
  if (rhs != (ON_SubDComponentPtrPair *)0x0) {
    if (lhs != (ON_SubDComponentPtrPair *)0x0) {
      uVar2 = lhs->m_pair[0].m_ptr & 0xfffffffffffffff8;
      uVar3 = rhs->m_pair[0].m_ptr & 0xfffffffffffffff8;
      uVar1 = 0xffffffff;
      if (uVar3 <= uVar2) {
        uVar1 = (uint)(uVar3 < uVar2);
      }
      return uVar1;
    }
    return 1;
  }
  return -1;
}

Assistant:

int ON_SubDComponentPtrPair::CompareFirstPointer(
  const ON_SubDComponentPtrPair* lhs,
  const ON_SubDComponentPtrPair* rhs
)
{
  if (lhs == rhs)
    return 0;
  // nulls sort to end.
  if (nullptr == rhs)
    return -1;
  if (nullptr == lhs)
    return 1;
  const ON__UINT_PTR lhs_ptr = (ON_SUBD_COMPONENT_POINTER_MASK & lhs->m_pair[0].m_ptr);
  const ON__UINT_PTR rhs_ptr = (ON_SUBD_COMPONENT_POINTER_MASK & rhs->m_pair[0].m_ptr);
  if (lhs_ptr < rhs_ptr)
    return -1;
  if (lhs_ptr > rhs_ptr)
    return 1;
  return 0;
}